

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::DrawBuffersIndexedTest::init
          (DrawBuffersIndexedTest *this,EVP_PKEY_CTX *ctx)

{
  bool *pbVar1;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *pEVar2;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *pEVar3;
  BlendFunc *pBVar4;
  Vector<bool,_4> *pVVar5;
  bool bVar6;
  ContextType ctxType;
  undefined7 extraout_var;
  NotSupportedError *this_00;
  undefined7 extraout_var_00;
  int i;
  long lVar8;
  undefined1 local_78 [8];
  anon_union_8_2_d0736028_for_Maybe<bool>_2 local_70;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *local_68;
  anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
  local_60;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *local_48;
  anon_union_32_2_d0736028_for_Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>_2
  local_40;
  Vector<bool,_4> *local_20;
  Vector<bool,_4> local_18 [2];
  int iVar7;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar6 = glu::contextSupports(ctxType,(ApiType)0x23);
  iVar7 = (int)CONCAT71(extraout_var,bVar6);
  if (!bVar6) {
    local_78 = (undefined1  [8])0x0;
    pbVar1 = (this->m_postCommonBlendState).enableBlend.m_ptr;
    if (pbVar1 != (bool *)0x0) {
      local_78 = (undefined1  [8])(local_78 + 8);
      local_70.m_data[0] = (deUint8  [1])*pbVar1;
    }
    local_68 = (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                *)0x0;
    pEVar2 = (this->m_postCommonBlendState).blendEq.m_ptr;
    if (pEVar2 != (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                   *)0x0) {
      local_68 = (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                  *)(local_78 + 0x18);
      local_60.m_data[0] = pEVar2->m_isFirst;
      local_60._8_8_ = local_78 + 0x28;
      if ((bool)local_60.m_data[0] == true) {
        local_60._16_4_ = ((pEVar2->field_1).m_second)->rgb;
      }
      else {
        local_60._16_8_ = *(pEVar2->field_1).m_second;
      }
    }
    local_48 = (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                *)0x0;
    pEVar3 = (this->m_postCommonBlendState).blendFunc.m_ptr;
    if (pEVar3 != (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                   *)0x0) {
      local_48 = (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                  *)(local_78 + 0x38);
      local_40.m_data[0] = pEVar3->m_isFirst;
      local_40._8_8_ = local_78 + 0x48;
      pBVar4 = (pEVar3->field_1).m_first;
      if ((bool)local_40.m_data[0] == true) {
        local_40._16_8_ = *pBVar4;
      }
      else {
        local_40._16_8_ = *pBVar4;
        local_40._24_8_ = pBVar4[1];
      }
    }
    local_20 = (Vector<bool,_4> *)0x0;
    pVVar5 = (this->m_postCommonBlendState).colorMask.m_ptr;
    if (pVVar5 != (Vector<bool,_4> *)0x0) {
      local_20 = local_18;
      lVar8 = 0;
      do {
        local_18[0].m_data[lVar8] = pVVar5->m_data[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
    }
    bVar6 = requiresAdvancedBlendEq
                      (&this->m_preCommonBlendState,(BlendState *)local_78,&this->m_drawBuffers);
    if (bVar6) {
      bVar6 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_KHR_blend_equation_advanced");
      if (local_48 !=
          (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
           *)0x0) {
        local_48->m_isFirst = true;
        (local_48->field_1).m_first = (BlendFunc *)0x0;
      }
      if (local_68 !=
          (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
          0x0) {
        local_68->m_isFirst = true;
        (local_68->field_1).m_first = (uint *)0x0;
      }
      if (!bVar6) {
        this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_00,"Extension GL_KHR_blend_equation_advanced not supported",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                   ,0x4ae);
        goto LAB_0169ee49;
      }
    }
    else {
      if (local_48 !=
          (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
           *)0x0) {
        local_48->m_isFirst = true;
        (local_48->field_1).m_first = (BlendFunc *)0x0;
      }
      if (local_68 !=
          (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
          0x0) {
        local_68->m_isFirst = true;
        (local_68->field_1).m_first = (uint *)0x0;
      }
    }
    bVar6 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_draw_buffers_indexed");
    iVar7 = (int)CONCAT71(extraout_var_00,bVar6);
    if (!bVar6) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Extension GL_EXT_draw_buffers_indexed not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                 ,0x4b1);
LAB_0169ee49:
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return iVar7;
}

Assistant:

void DrawBuffersIndexedTest::init (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32)
	{
		if (requiresAdvancedBlendEq(m_preCommonBlendState, m_postCommonBlendState, m_drawBuffers) && !m_context.getContextInfo().isExtensionSupported("GL_KHR_blend_equation_advanced"))
			TCU_THROW(NotSupportedError, "Extension GL_KHR_blend_equation_advanced not supported");

		if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_draw_buffers_indexed"))
			TCU_THROW(NotSupportedError, "Extension GL_EXT_draw_buffers_indexed not supported");
	}
}